

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O0

Maybe<unsigned_long> __thiscall
rc::Seq<unsigned_long>::SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_>::next
          (SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_> *this)

{
  Maybe<unsigned_long> MVar1;
  SeqImpl<rc::shrink::detail::TowardsSeq<unsigned_long>_> *this_local;
  
  MVar1 = rc::shrink::detail::TowardsSeq<unsigned_long>::operator()
                    ((TowardsSeq<unsigned_long> *)this);
  MVar1.m_storage = (Storage)this;
  return MVar1;
}

Assistant:

Maybe<T> next() override { return m_impl(); }